

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O2

void __thiscall
capnp::JsonCodec::addFieldHandlerImpl(JsonCodec *this,Field field,Type type,HandlerBase *handler)

{
  HashMap<capnp::StructSchema::Field,_capnp::JsonCodec::HandlerBase_*> *table;
  Impl *pIVar1;
  Fault local_c0;
  Fault f;
  anon_union_8_2_eba6ea51_for_Type_5 local_b0;
  Type *local_90;
  Type type_local;
  DebugComparison<capnp::Type_&,_capnp::Type> _kjCondition;
  
  type_local.field_4 = type.field_4;
  type_local._0_8_ = type._0_8_;
  local_90 = &type_local;
  _f = StructSchema::Field::getType(&field);
  kj::_::DebugExpression<capnp::Type&>::operator==
            (&_kjCondition,(DebugExpression<capnp::Type&> *)&local_90,(Type *)&f);
  if (_kjCondition.result == false) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::Type&,capnp::Type>&,char_const(&)[60]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compat/json.c++"
               ,900,FAILED,"type == field.getType()",
               "_kjCondition,\"handler type did not match field type for addFieldHandler()\"",
               &_kjCondition,
               (char (*) [60])"handler type did not match field type for addFieldHandler()");
    kj::_::Debug::Fault::fatal(&f);
  }
  pIVar1 = (this->impl).ptr;
  table = &pIVar1->fieldHandlers;
  _kjCondition.op.content.size_ = (size_t)field.proto._reader.data;
  _kjCondition._40_8_ = field.proto._reader.pointers;
  _kjCondition.right.field_4.schema = (RawBrandedSchema *)field.proto._reader.segment;
  _kjCondition.op.content.ptr = (char *)field.proto._reader.capTable;
  _kjCondition.left = (Type *)field.parent.super_Schema.raw;
  _kjCondition.right._0_8_ = field._8_8_;
  kj::
  Table<kj::HashMap<capnp::StructSchema::Field,_capnp::JsonCodec::HandlerBase_*>::Entry,_kj::HashIndex<kj::HashMap<capnp::StructSchema::Field,_capnp::JsonCodec::HandlerBase_*>::Callbacks>_>
  ::Impl<0UL,_false>::insert
            ((Impl<0UL,_false> *)&f,&table->table,
             ((long)(pIVar1->fieldHandlers).table.rows.builder.pos -
             (long)(pIVar1->fieldHandlers).table.rows.builder.ptr) / 0x48,(Entry *)&_kjCondition,
             0xffffffff);
  if ((char)f.exception == '\x01') {
    f.exception = (Exception *)&(table->table).rows.builder.ptr[local_b0.scopeId].value;
    local_b0.schema = (RawBrandedSchema *)&local_90;
    if (*(HandlerBase **)f.exception != handler) {
      local_90 = (Type *)handler;
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::JsonCodec::HandlerBase*&,capnp::JsonCodec::HandlerBase*&>&,char_const(&)[49]>
                (&local_c0,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compat/json.c++"
                 ,0x386,FAILED,"existing == replacement",
                 "_kjCondition,\"field already has a different registered handler\"",
                 (DebugComparison<capnp::JsonCodec::HandlerBase_*&,_capnp::JsonCodec::HandlerBase_*&>
                  *)&f,(char (*) [49])"field already has a different registered handler");
      kj::_::Debug::Fault::fatal(&local_c0);
    }
  }
  else {
    kj::Vector<kj::HashMap<capnp::StructSchema::Field,capnp::JsonCodec::HandlerBase*>::Entry>::
    add<kj::HashMap<capnp::StructSchema::Field,capnp::JsonCodec::HandlerBase*>::Entry>
              ((Vector<kj::HashMap<capnp::StructSchema::Field,capnp::JsonCodec::HandlerBase*>::Entry>
                *)table,(Entry *)&_kjCondition);
  }
  return;
}

Assistant:

void JsonCodec::addFieldHandlerImpl(StructSchema::Field field, Type type, HandlerBase& handler) {
  KJ_REQUIRE(type == field.getType(),
      "handler type did not match field type for addFieldHandler()");
  impl->fieldHandlers.upsert(field, &handler, [](HandlerBase*& existing, HandlerBase* replacement) {
    KJ_REQUIRE(existing == replacement, "field already has a different registered handler");
  });
}